

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io.c
# Opt level: O1

int gdGetWord(int *result,gdIOCtx *ctx)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (*ctx->getC)(ctx);
  iVar2 = 0;
  if (iVar1 != -1) {
    *result = iVar1 << 8;
    iVar1 = (*ctx->getC)(ctx);
    iVar2 = 0;
    if (iVar1 != -1) {
      *result = *result + iVar1;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int gdGetWord(int *result, gdIOCtx *ctx)
{
	int r;

	r = (ctx->getC)(ctx);
	if(r == EOF) {
		return 0;
	}

	*result = r << 8;

	r = (ctx->getC)(ctx);
	if(r == EOF) {
		return 0;
	}

	*result += r;

	return 1;
}